

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

uint8_t * BrotliEncoderTakeOutput(BrotliEncoderStateInternal *s,size_t *size)

{
  ulong uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  ulong uVar4;
  
  uVar1 = s->available_out_;
  uVar2 = *size;
  uVar4 = uVar1;
  if (uVar2 < uVar1) {
    uVar4 = uVar2;
  }
  if (uVar2 == 0) {
    uVar4 = uVar1;
  }
  if (uVar4 == 0) {
    uVar4 = 0;
    puVar3 = (uint8_t *)0x0;
  }
  else {
    puVar3 = s->next_out_;
    s->next_out_ = puVar3 + uVar4;
    s->total_out_ = s->total_out_ + uVar4;
    s->available_out_ = uVar1 - uVar4;
    if ((uVar1 - uVar4 == 0) && (s->stream_state_ == BROTLI_STREAM_FLUSH_REQUESTED)) {
      s->stream_state_ = BROTLI_STREAM_PROCESSING;
      s->next_out_ = (uint8_t *)0x0;
    }
  }
  *size = uVar4;
  return puVar3;
}

Assistant:

const uint8_t* BrotliEncoderTakeOutput(BrotliEncoderState* s, size_t* size) {
  size_t consumed_size = s->available_out_;
  uint8_t* result = s->next_out_;
  if (*size) {
    consumed_size = BROTLI_MIN(size_t, *size, s->available_out_);
  }
  if (consumed_size) {
    s->next_out_ += consumed_size;
    s->available_out_ -= consumed_size;
    s->total_out_ += consumed_size;
    CheckFlushComplete(s);
    *size = consumed_size;
  } else {
    *size = 0;
    result = 0;
  }
  return result;
}